

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
               (QScreen *args,QRect args_1,QRect args_2)

{
  long lVar1;
  QRect args_2_00;
  QRect args_1_00;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ScreenGeometryEvent *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  ScreenGeometryEvent event;
  undefined4 in_stack_ffffffffffffff58;
  ProcessEventsFlag in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ScreenGeometryEvent *in_stack_ffffffffffffff70;
  WindowSystemEvent *in_stack_ffffffffffffff78;
  undefined1 local_70 [16];
  byte local_60;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QThread::isMainThread();
  if ((uVar4 & 1) == 0) {
    args_1_00._8_8_ = in_RDX;
    args_1_00._0_8_ = in_RSI;
    args_2_00._8_8_ = in_R8;
    args_2_00._0_8_ = in_RCX;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenGeometryEvent,QScreen*,QRect,QRect>
              ((QScreen *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),args_1_00,
               args_2_00);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_RDI,in_stack_ffffffffffffff5c);
    bVar2 = QWindowSystemInterface::flushWindowSystemEvents
                      ((ProcessEventsFlags)in_stack_ffffffffffffffbc.i);
    goto LAB_0044e8fe;
  }
  memset(local_70,0xaa,0x48);
  QWindowSystemInterfacePrivate::ScreenGeometryEvent::ScreenGeometryEvent
            (in_stack_ffffffffffffff70,
             (QScreen *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (QRect *)in_RDI,(QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
  ;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(in_stack_ffffffffffffff78);
LAB_0044e873:
    bVar2 = local_60 & 1;
  }
  else {
    uVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_70);
    if ((uVar3 & 1) != 0) goto LAB_0044e873;
    bVar2 = 0;
  }
  QWindowSystemInterfacePrivate::ScreenGeometryEvent::~ScreenGeometryEvent(in_RDI);
LAB_0044e8fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}